

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

Value * __thiscall GlobOptBlockData::FindObjectTypeValue(GlobOptBlockData *this,SymID typeSymId)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  Sym *pSVar4;
  undefined4 *puVar5;
  Value *pVVar6;
  
  pSVar4 = SymTable::Find(this->globOpt->func->m_symTable,typeSymId);
  if (pSVar4->m_kind != SymKindStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x52b,"(this->globOpt->func->m_symTable->Find(typeSymId)->IsStackSym())",
                       "this->globOpt->func->m_symTable->Find(typeSymId)->IsStackSym()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  BVar3 = BVSparse<Memory::JitArenaAllocator>::Test(this->liveFields,typeSymId);
  if (BVar3 != '\0') {
    pVVar6 = FindObjectTypeValueNoLivenessCheck(this,typeSymId);
    return pVVar6;
  }
  return (Value *)0x0;
}

Assistant:

Value *
GlobOptBlockData::FindObjectTypeValue(SymID typeSymId)
{
    Assert(this->globOpt->func->m_symTable->Find(typeSymId)->IsStackSym());
    if (!this->liveFields->Test(typeSymId))
    {
        return nullptr;
    }
    return FindObjectTypeValueNoLivenessCheck(typeSymId);
}